

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite_Internals.cpp
# Opt level: O3

void __thiscall
psy::C::InternalsTestSuite::reparse
          (InternalsTestSuite *this,string *source,DisambiguationStrategy strategy,Expectation *X)

{
  unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *this_00;
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  pointer pcVar4;
  ulong uVar5;
  pointer pSVar6;
  ParseOptions parseOptions;
  bool bVar7;
  int iVar8;
  SyntaxNode *pSVar9;
  ostream *poVar10;
  undefined8 uVar11;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t sVar12;
  size_t extraout_RDX_03;
  size_t extraout_RDX_04;
  long *plVar13;
  _Alloc_hider _Var14;
  char *pcVar15;
  char *pcVar16;
  long *plVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  char *pcVar19;
  iterator __end1;
  long lVar20;
  char *pcVar21;
  _Alloc_hider _Var22;
  byte bVar23;
  iterator __begin1;
  long *plVar24;
  pointer pSVar25;
  string names;
  string textP;
  string namesP;
  string text;
  SyntaxNamePrinter printer;
  Unparser unparser;
  ParseOptions parseOpts;
  ostringstream ossTree;
  ostringstream ossText;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  long *local_4f8;
  ulong local_4f0;
  long local_4e8 [2];
  string local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  SyntaxNamePrinter local_498;
  long *local_470 [2];
  long local_460 [2];
  Unparser local_450;
  SourceText local_438;
  ParseOptions local_418;
  ParseOptions local_3f8;
  Expectation local_3d8;
  long *local_320 [2];
  long local_310 [12];
  ios_base local_2b0 [264];
  SourceText local_1a8 [3];
  ios_base local_138 [264];
  
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  pcVar4 = (source->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4b8,pcVar4,pcVar4 + source->_M_string_length);
  ParseOptions::ParseOptions(&local_418);
  if (strategy == TypeSynonymsVerification) {
    bVar23 = 1;
    ParseOptions::setAmbiguityMode(&local_418,DisambiguateAlgorithmically);
  }
  else if (strategy == SyntaxCorrelation) {
    bVar23 = 2;
    ParseOptions::setAmbiguityMode(&local_418,DisambiguateAlgorithmically);
  }
  else {
    if (strategy != GuidelineImposition) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tReason: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"unknown strategy",0x10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x138);
      std::endl<char,std::char_traits<char>>(poVar10);
      uVar11 = __cxa_allocate_exception(1);
      __cxa_throw(uVar11,&TestFailed::typeinfo,0);
    }
    ParseOptions::setAmbiguityMode(&local_418,DisambiguateHeuristically);
    bVar23 = 0;
  }
  local_470[0] = local_460;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_470,local_4b8._M_dataplus._M_p,
             local_4b8._M_dataplus._M_p + local_4b8._M_string_length);
  psy::SourceText::SourceText(&local_438,local_470);
  local_3f8.langExts_.field_1._0_4_ = local_418.langExts_.field_1.BF_all_._0_4_;
  local_3f8.langExts_.field_1._4_4_ = local_418.langExts_.field_1.BF_all_._4_4_;
  local_3f8.field_2 = local_418.field_2;
  local_3f8._26_2_ = local_418._26_2_;
  local_3f8._28_4_ = local_418._28_4_;
  local_3f8.langDialect_.std_ = local_418.langDialect_.std_;
  local_3f8._1_3_ = local_418._1_3_;
  local_3f8._4_4_ = local_418._4_4_;
  local_3f8.langExts_.translations_.field_0._0_4_ =
       local_418.langExts_.translations_.field_0.BF_all_._0_4_;
  local_3f8.langExts_.translations_.field_0._4_4_ =
       local_418.langExts_.translations_.field_0.BF_all_._4_4_;
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"");
  parseOptions._4_4_ = local_3f8._4_4_;
  parseOptions.langDialect_.std_ = local_3f8.langDialect_.std_;
  parseOptions._1_3_ = local_3f8._1_3_;
  parseOptions.langExts_.translations_.field_0.BF_all_._4_4_ =
       local_3f8.langExts_.translations_.field_0._4_4_;
  parseOptions.langExts_.translations_.field_0.BF_all_._0_4_ =
       local_3f8.langExts_.translations_.field_0._0_4_;
  parseOptions.langExts_.field_1.BF_all_._4_4_ = local_3f8.langExts_.field_1._4_4_;
  parseOptions.langExts_.field_1.BF_all_._0_4_ = local_3f8.langExts_.field_1._0_4_;
  parseOptions._28_4_ = local_3f8._28_4_;
  parseOptions.field_2 = local_3f8.field_2;
  parseOptions._26_2_ = local_3f8._26_2_;
  SyntaxTree::parseText
            (local_1a8,(TextPreprocessingState)&local_438,Unknown,parseOptions,
             (string *)(ulong)bVar23,(SyntaxCategory)local_320);
  _Var22._M_p = local_1a8[0].rawText_._M_dataplus._M_p;
  this_00 = &this->tree_;
  local_1a8[0].rawText_._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::reset
            ((__uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *)
             this_00,(pointer)_Var22._M_p);
  std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *)local_1a8);
  if (local_320[0] != local_310) {
    operator_delete(local_320[0],local_310[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.rawText_._M_dataplus._M_p != &local_438.rawText_.field_2) {
    operator_delete(local_438.rawText_._M_dataplus._M_p,
                    local_438.rawText_.field_2._M_allocated_capacity + 1);
  }
  if (local_470[0] != local_460) {
    operator_delete(local_470[0],local_460[0] + 1);
  }
  if (X->containsAmbiguity_ == false) {
    Expectation::Expectation(&local_3d8,X);
    bVar7 = checkErrorAndWarn(this,&local_3d8);
    if (local_3d8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3d8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3d8.scopePath_.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3d8.scopePath_.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_3d8.declarations_);
    if (local_3d8.syntaxKinds_.
        super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3d8.syntaxKinds_.
                      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_3d8.syntaxKinds_.
                            super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3d8.syntaxKinds_.
                            super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.ambiguityText_._M_dataplus._M_p != &local_3d8.ambiguityText_.field_2) {
      operator_delete(local_3d8.ambiguityText_._M_dataplus._M_p,
                      local_3d8.ambiguityText_.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3d8.descriptorsW_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3d8.descriptorsE_);
    if (!bVar7) goto LAB_003f0236;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  SyntaxVisitor::SyntaxVisitor
            ((SyntaxVisitor *)&local_498,
             (this_00->_M_t).
             super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>.
             _M_t.
             super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>.
             super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  local_498.super_SyntaxDumper.super_SyntaxVisitor._vptr_SyntaxVisitor =
       (_func_int **)&PTR__SyntaxNamePrinter_004f4470;
  local_498.dump_.
  super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.dump_.
  super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498.dump_.
  super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar9 = SyntaxTree::root((this_00->_M_t).
                            super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>
                            .super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  SyntaxNamePrinter::print(&local_498,pSVar9,Plain,(ostream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  SyntaxVisitor::SyntaxVisitor
            ((SyntaxVisitor *)&local_450,
             (this_00->_M_t).
             super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>.
             _M_t.
             super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>.
             super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  local_450.super_SyntaxDumper.super_SyntaxVisitor._vptr_SyntaxVisitor =
       (_func_int **)&PTR__SyntaxVisitor_0051e2c0;
  pSVar9 = SyntaxTree::root((this_00->_M_t).
                            super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>
                            .super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  Unparser::unparse(&local_450,pSVar9,(ostream *)local_1a8);
  std::__cxx11::stringbuf::str();
  plVar24 = local_4f8;
  plVar1 = (long *)((long)local_4f8 + local_4f0);
  plVar13 = local_4f8;
  if (0 < (long)local_4f0 >> 2) {
    plVar13 = (long *)((long)local_4f8 + (local_4f0 & 0xfffffffffffffffc));
    lVar20 = ((long)local_4f0 >> 2) + 1;
    plVar17 = (long *)((long)local_4f8 + 3);
    do {
      iVar8 = isspace((int)*(char *)((long)plVar17 + -3));
      if (iVar8 != 0) {
        plVar17 = (long *)((long)plVar17 + -3);
        goto LAB_003efa16;
      }
      iVar8 = isspace((int)*(char *)((long)plVar17 + -2));
      if (iVar8 != 0) {
        plVar17 = (long *)((long)plVar17 + -2);
        goto LAB_003efa16;
      }
      iVar8 = isspace((int)*(char *)((long)plVar17 + -1));
      if (iVar8 != 0) {
        plVar17 = (long *)((long)plVar17 + -1);
        goto LAB_003efa16;
      }
      iVar8 = isspace((int)(char)*plVar17);
      if (iVar8 != 0) goto LAB_003efa16;
      lVar20 = lVar20 + -1;
      plVar17 = (long *)((long)plVar17 + 4);
    } while (1 < lVar20);
  }
  lVar20 = (long)plVar1 - (long)plVar13;
  if (lVar20 == 1) {
LAB_003ef9f3:
    iVar8 = isspace((int)(char)*plVar13);
    plVar17 = plVar13;
    if (iVar8 == 0) {
      plVar17 = plVar1;
    }
LAB_003efa16:
    plVar13 = (long *)((long)plVar17 + 1);
    if (plVar13 != plVar1 && plVar17 != plVar1) {
      do {
        lVar20 = *plVar13;
        iVar8 = isspace((int)(char)lVar20);
        if (iVar8 == 0) {
          *(char *)plVar17 = (char)lVar20;
          plVar17 = (long *)((long)plVar17 + 1);
        }
        plVar13 = (long *)((long)plVar13 + 1);
        plVar24 = local_4f8;
      } while (plVar13 != plVar1);
    }
  }
  else {
    if (lVar20 == 2) {
LAB_003ef9e3:
      iVar8 = isspace((int)(char)*plVar13);
      plVar17 = plVar13;
      if (iVar8 == 0) {
        plVar13 = (long *)((long)plVar13 + 1);
        goto LAB_003ef9f3;
      }
      goto LAB_003efa16;
    }
    plVar17 = plVar1;
    if (lVar20 == 3) {
      iVar8 = isspace((int)(char)*plVar13);
      plVar17 = plVar13;
      if (iVar8 == 0) {
        plVar13 = (long *)((long)plVar13 + 1);
        goto LAB_003ef9e3;
      }
      goto LAB_003efa16;
    }
  }
  _Var22._M_p = local_4b8._M_dataplus._M_p;
  local_4f0 = (long)plVar17 - (long)plVar24;
  *(char *)plVar17 = '\0';
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_4b8._M_dataplus._M_p + local_4b8._M_string_length);
  _Var14._M_p = local_4b8._M_dataplus._M_p;
  if (0 < (long)local_4b8._M_string_length >> 2) {
    _Var14._M_p = local_4b8._M_dataplus._M_p + (local_4b8._M_string_length & 0xfffffffffffffffc);
    lVar20 = ((long)local_4b8._M_string_length >> 2) + 1;
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_4b8._M_dataplus._M_p + 3);
    do {
      iVar8 = isspace((int)paVar18->_M_local_buf[-3]);
      if (iVar8 != 0) {
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar18->_M_local_buf + -3);
        goto LAB_003efb48;
      }
      iVar8 = isspace((int)paVar18->_M_local_buf[-2]);
      if (iVar8 != 0) {
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar18->_M_local_buf + -2);
        goto LAB_003efb48;
      }
      iVar8 = isspace((int)paVar18->_M_local_buf[-1]);
      if (iVar8 != 0) {
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar18->_M_local_buf + -1);
        goto LAB_003efb48;
      }
      iVar8 = isspace((int)paVar18->_M_local_buf[0]);
      if (iVar8 != 0) goto LAB_003efb48;
      lVar20 = lVar20 + -1;
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar18->_M_local_buf + 4);
    } while (1 < lVar20);
  }
  lVar20 = (long)paVar2 - (long)_Var14._M_p;
  if (lVar20 == 1) {
LAB_003efb25:
    iVar8 = isspace((int)*_Var14._M_p);
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var14._M_p;
    if (iVar8 == 0) {
      paVar18 = paVar2;
    }
LAB_003efb48:
    pcVar21 = paVar18->_M_local_buf + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar21 != paVar2 && paVar18 != paVar2) {
      do {
        cVar3 = *pcVar21;
        iVar8 = isspace((int)cVar3);
        if (iVar8 == 0) {
          paVar18->_M_local_buf[0] = cVar3;
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar18->_M_local_buf + 1);
        }
        pcVar21 = pcVar21 + 1;
        _Var22._M_p = local_4b8._M_dataplus._M_p;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar21 != paVar2);
    }
  }
  else {
    if (lVar20 == 2) {
LAB_003efb15:
      iVar8 = isspace((int)*_Var14._M_p);
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var14._M_p;
      if (iVar8 == 0) {
        _Var14._M_p = _Var14._M_p + 1;
        goto LAB_003efb25;
      }
      goto LAB_003efb48;
    }
    paVar18 = paVar2;
    if (lVar20 == 3) {
      iVar8 = isspace((int)*_Var14._M_p);
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var14._M_p;
      if (iVar8 == 0) {
        _Var14._M_p = _Var14._M_p + 1;
        goto LAB_003efb15;
      }
      goto LAB_003efb48;
    }
  }
  local_4b8._M_string_length = (long)paVar18 - (long)_Var22._M_p;
  paVar18->_M_local_buf[0] = '\0';
  if (X->containsAmbiguity_ != true) {
    if ((local_4f0 == local_4b8._M_string_length) &&
       ((sVar12 = local_4f0, local_4f0 == 0 ||
        (iVar8 = bcmp(local_4f8,local_4b8._M_dataplus._M_p,local_4f0), sVar12 = extraout_RDX,
        iVar8 == 0)))) goto LAB_003effa4;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_4f8,local_4f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\tExpected: ",0xc);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
               ,99);
    iVar8 = 0x167;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,":",1);
LAB_003eff51:
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar8);
    std::endl<char,std::char_traits<char>>(poVar10);
LAB_003eff63:
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  uVar5 = (X->ambiguityText_)._M_string_length;
  if (uVar5 == 0) {
    std::operator+(&local_518,&local_4b8,&local_4b8);
    _Var22._M_p = local_518._M_dataplus._M_p;
    sVar12 = local_4f0;
    if (local_4f0 == local_518._M_string_length) {
      if (local_4f0 == 0) {
        bVar7 = true;
      }
      else {
        iVar8 = bcmp(local_4f8,local_518._M_dataplus._M_p,local_4f0);
        bVar7 = iVar8 == 0;
        sVar12 = extraout_RDX_00;
      }
    }
    else {
      bVar7 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var22._M_p != &local_518.field_2) {
      operator_delete(_Var22._M_p,
                      CONCAT71(local_518.field_2._M_allocated_capacity._1_7_,
                               local_518.field_2._M_local_buf[0]) + 1);
      sVar12 = extraout_RDX_02;
    }
    if (!bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_4f8,local_4f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\tExpected: ",0xc);
      std::operator+(&local_518,&local_4b8,&local_4b8);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_518._M_dataplus._M_p,local_518._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,":",1);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x15d);
      std::endl<char,std::char_traits<char>>(poVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_dataplus._M_p != &local_518.field_2) {
        operator_delete(local_518._M_dataplus._M_p,
                        CONCAT71(local_518.field_2._M_allocated_capacity._1_7_,
                                 local_518.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_003eff63;
    }
  }
  else {
    pcVar16 = (X->ambiguityText_)._M_dataplus._M_p;
    pcVar21 = pcVar16 + uVar5;
    pcVar15 = pcVar16;
    if (0 < (long)uVar5 >> 2) {
      pcVar15 = pcVar16 + (uVar5 & 0xfffffffffffffffc);
      lVar20 = ((long)uVar5 >> 2) + 1;
      pcVar19 = pcVar16 + 3;
      do {
        iVar8 = isspace((int)pcVar19[-3]);
        if (iVar8 != 0) {
          pcVar19 = pcVar19 + -3;
          goto LAB_003efe01;
        }
        iVar8 = isspace((int)pcVar19[-2]);
        if (iVar8 != 0) {
          pcVar19 = pcVar19 + -2;
          goto LAB_003efe01;
        }
        iVar8 = isspace((int)pcVar19[-1]);
        if (iVar8 != 0) {
          pcVar19 = pcVar19 + -1;
          goto LAB_003efe01;
        }
        iVar8 = isspace((int)*pcVar19);
        if (iVar8 != 0) goto LAB_003efe01;
        lVar20 = lVar20 + -1;
        pcVar19 = pcVar19 + 4;
      } while (1 < lVar20);
    }
    lVar20 = (long)pcVar21 - (long)pcVar15;
    if (lVar20 == 1) {
LAB_003efc70:
      iVar8 = isspace((int)*pcVar15);
      pcVar19 = pcVar15;
      if (iVar8 == 0) {
        pcVar19 = pcVar21;
      }
LAB_003efe01:
      pcVar15 = pcVar19 + 1;
      if (pcVar15 != pcVar21 && pcVar19 != pcVar21) {
        do {
          cVar3 = *pcVar15;
          iVar8 = isspace((int)cVar3);
          if (iVar8 == 0) {
            *pcVar19 = cVar3;
            pcVar19 = pcVar19 + 1;
          }
          pcVar15 = pcVar15 + 1;
        } while (pcVar15 != pcVar21);
        pcVar16 = (X->ambiguityText_)._M_dataplus._M_p;
      }
    }
    else {
      if (lVar20 == 2) {
LAB_003efc60:
        iVar8 = isspace((int)*pcVar15);
        pcVar19 = pcVar15;
        if (iVar8 == 0) {
          pcVar15 = pcVar15 + 1;
          goto LAB_003efc70;
        }
        goto LAB_003efe01;
      }
      pcVar19 = pcVar21;
      if (lVar20 == 3) {
        iVar8 = isspace((int)*pcVar15);
        pcVar19 = pcVar15;
        if (iVar8 == 0) {
          pcVar15 = pcVar15 + 1;
          goto LAB_003efc60;
        }
        goto LAB_003efe01;
      }
    }
    (X->ambiguityText_)._M_string_length = (long)pcVar19 - (long)pcVar16;
    *pcVar19 = '\0';
    if ((local_4f0 != (X->ambiguityText_)._M_string_length) ||
       ((sVar12 = local_4f0, local_4f0 != 0 &&
        (iVar8 = bcmp(local_4f8,(X->ambiguityText_)._M_dataplus._M_p,local_4f0),
        sVar12 = extraout_RDX_01, iVar8 != 0)))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_4f8,local_4f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\tExpected: ",0xc);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(X->ambiguityText_)._M_dataplus._M_p,
                           (X->ambiguityText_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                 ,99);
      iVar8 = 0x163;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,":",1);
      goto LAB_003eff51;
    }
  }
LAB_003effa4:
  pSVar25 = (X->syntaxKinds_).
            super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar6 = (X->syntaxKinds_).
           super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar25 != pSVar6) {
    local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
    local_518._M_string_length = 0;
    local_518.field_2._M_local_buf[0] = '\0';
    do {
      to_string_abi_cxx11_(&local_4d8,(C *)(ulong)*pSVar25,(SyntaxKind)sVar12);
      std::__cxx11::string::_M_append((char *)&local_518,(ulong)local_4d8._M_dataplus._M_p);
      sVar12 = extraout_RDX_03;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
        sVar12 = extraout_RDX_04;
      }
      pSVar25 = pSVar25 + 1;
    } while (pSVar25 != pSVar6);
    std::__cxx11::stringbuf::str();
    _Var22._M_p = local_4d8._M_dataplus._M_p;
    pcVar21 = local_4d8._M_dataplus._M_p + local_4d8._M_string_length;
    _Var14._M_p = local_4d8._M_dataplus._M_p;
    if (0 < (long)local_4d8._M_string_length >> 2) {
      _Var14._M_p = local_4d8._M_dataplus._M_p + (local_4d8._M_string_length & 0xfffffffffffffffc);
      lVar20 = ((long)local_4d8._M_string_length >> 2) + 1;
      pcVar16 = local_4d8._M_dataplus._M_p + 3;
      do {
        iVar8 = isspace((int)pcVar16[-3]);
        if (iVar8 != 0) {
          pcVar16 = pcVar16 + -3;
          goto LAB_003f00f6;
        }
        iVar8 = isspace((int)pcVar16[-2]);
        if (iVar8 != 0) {
          pcVar16 = pcVar16 + -2;
          goto LAB_003f00f6;
        }
        iVar8 = isspace((int)pcVar16[-1]);
        if (iVar8 != 0) {
          pcVar16 = pcVar16 + -1;
          goto LAB_003f00f6;
        }
        iVar8 = isspace((int)*pcVar16);
        if (iVar8 != 0) goto LAB_003f00f6;
        lVar20 = lVar20 + -1;
        pcVar16 = pcVar16 + 4;
      } while (1 < lVar20);
    }
    lVar20 = (long)pcVar21 - (long)_Var14._M_p;
    if (lVar20 == 1) {
LAB_003f00d3:
      iVar8 = isspace((int)*_Var14._M_p);
      pcVar16 = _Var14._M_p;
      if (iVar8 == 0) {
        pcVar16 = pcVar21;
      }
LAB_003f00f6:
      pcVar15 = pcVar16 + 1;
      if (pcVar15 != pcVar21 && pcVar16 != pcVar21) {
        do {
          cVar3 = *pcVar15;
          iVar8 = isspace((int)cVar3);
          if (iVar8 == 0) {
            *pcVar16 = cVar3;
            pcVar16 = pcVar16 + 1;
          }
          pcVar15 = pcVar15 + 1;
          _Var22._M_p = local_4d8._M_dataplus._M_p;
        } while (pcVar15 != pcVar21);
      }
    }
    else {
      if (lVar20 == 2) {
LAB_003f00c3:
        iVar8 = isspace((int)*_Var14._M_p);
        pcVar16 = _Var14._M_p;
        if (iVar8 == 0) {
          _Var14._M_p = _Var14._M_p + 1;
          goto LAB_003f00d3;
        }
        goto LAB_003f00f6;
      }
      pcVar16 = pcVar21;
      if (lVar20 == 3) {
        iVar8 = isspace((int)*_Var14._M_p);
        pcVar16 = _Var14._M_p;
        if (iVar8 == 0) {
          _Var14._M_p = _Var14._M_p + 1;
          goto LAB_003f00c3;
        }
        goto LAB_003f00f6;
      }
    }
    _Var14._M_p = local_4d8._M_dataplus._M_p;
    local_4d8._M_string_length = (long)pcVar16 - (long)_Var22._M_p;
    *pcVar16 = '\0';
    if ((local_4d8._M_string_length != local_518._M_string_length) ||
       ((local_4d8._M_string_length != 0 &&
        (iVar8 = bcmp(local_4d8._M_dataplus._M_p,local_518._M_dataplus._M_p,
                      local_4d8._M_string_length), iVar8 != 0)))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_4d8._M_dataplus._M_p,
                           local_4d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\tExpected: ",0xc);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_518._M_dataplus._M_p,local_518._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,":",1);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x172);
      std::endl<char,std::char_traits<char>>(poVar10);
      uVar11 = __cxa_allocate_exception(1);
      __cxa_throw(uVar11,&TestFailed::typeinfo,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var14._M_p != &local_4d8.field_2) {
      operator_delete(_Var14._M_p,local_4d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,
                      CONCAT71(local_518.field_2._M_allocated_capacity._1_7_,
                               local_518.field_2._M_local_buf[0]) + 1);
    }
  }
  if (local_4f8 != local_4e8) {
    operator_delete(local_4f8,local_4e8[0] + 1);
  }
  SyntaxVisitor::~SyntaxVisitor((SyntaxVisitor *)&local_450);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_498.dump_.
      super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.dump_.
                    super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_498.dump_.
                          super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_498.dump_.
                          super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  SyntaxVisitor::~SyntaxVisitor((SyntaxVisitor *)&local_498);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
LAB_003f0236:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void InternalsTestSuite::reparse(std::string source,
                                 Reparser::DisambiguationStrategy strategy,
                                 Expectation X)
{
    auto text = source;

    ParseOptions parseOpts;
    TextCompleteness textCompleness;
    switch (strategy) {
        case Reparser::DisambiguationStrategy::SyntaxCorrelation:
            parseOpts.setAmbiguityMode(
                        ParseOptions::AmbiguityMode::DisambiguateAlgorithmically);
            textCompleness = TextCompleteness::Fragment;
            break;

        case Reparser::DisambiguationStrategy::TypeSynonymsVerification:
            parseOpts.setAmbiguityMode(
                        ParseOptions::AmbiguityMode::DisambiguateAlgorithmically);
            textCompleness = TextCompleteness::Full;
            break;

        case Reparser::DisambiguationStrategy::GuidelineImposition:
            parseOpts.setAmbiguityMode(
                        ParseOptions::AmbiguityMode::DisambiguateHeuristically);
            textCompleness = TextCompleteness::Unknown;
            break;

        default:
            PSY__internals__FAIL("unknown strategy");
    }

    tree_ = SyntaxTree::parseText(text,
                                  TextPreprocessingState::Unknown,
                                  textCompleness,
                                  parseOpts,
                                  "");

    if (!X.containsAmbiguity_ && !checkErrorAndWarn(X))
        return;

    std::ostringstream ossTree;
    SyntaxNamePrinter printer(tree_.get());
    printer.print(tree_->root(),
                  SyntaxNamePrinter::Style::Plain,
                  ossTree);

#ifdef DUMP_AST
    std::cout << "\n\n"
              << "========================== AST ==================================\n"
              << source << "\n"
              << "-----------------------------------------------------------------"
              << ossTree.str()
              << "=================================================================\n";
#endif

    std::ostringstream ossText;
    Unparser unparser(tree_.get());
    unparser.unparse(tree_->root(), ossText);

    std::string textP = ossText.str();
    textP.erase(std::remove_if(textP.begin(), textP.end(), ::isspace), textP.end());
    text.erase(std::remove_if(text.begin(), text.end(), ::isspace), text.end());

    if (X.containsAmbiguity_) {
        if (X.ambiguityText_.empty())
            PSY_EXPECT_EQ_STR(textP, text + text);
        else {
            X.ambiguityText_.erase(
                        std::remove_if(X.ambiguityText_.begin(),
                                       X.ambiguityText_.end(), ::isspace),
                        X.ambiguityText_.end());
            PSY_EXPECT_EQ_STR(textP, X.ambiguityText_);
        }
    }
    else
        PSY_EXPECT_EQ_STR(textP, text);

    if (X.syntaxKinds_.empty())
        return;

    std::string names;
    for (auto k : X.syntaxKinds_)
        names += to_string(k);

    std::string namesP = ossTree.str();
    namesP.erase(std::remove_if(namesP.begin(), namesP.end(), ::isspace), namesP.end());
    PSY_EXPECT_EQ_STR(namesP, names);
}